

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp_examples.cpp
# Opt level: O2

void saveToFile(int **mrx,int height,int width,char *filename)

{
  FILE *__stream;
  ulong uVar1;
  int j;
  ulong uVar2;
  ulong uVar3;
  
  __stream = fopen(filename,"w");
  if (width < 1) {
    width = 0;
  }
  uVar2 = (ulong)(uint)height;
  if (height < 1) {
    uVar2 = 0;
  }
  for (uVar1 = 0; uVar1 != uVar2; uVar1 = uVar1 + 1) {
    for (uVar3 = 0; (uint)width != uVar3; uVar3 = uVar3 + 1) {
      fprintf(__stream,"%3d,",(ulong)(uint)mrx[uVar1][uVar3]);
    }
    fputc(10,__stream);
  }
  fclose(__stream);
  return;
}

Assistant:

void saveToFile(int **mrx, const int height, const int width, const char *filename) {
    FILE *file = fopen(filename, "w");
    for (int i = 0; i < height; i++) {
        for (int j = 0; j < width; j++) {
            fprintf(file, "%3d,", mrx[i][j]);
        }
        fprintf(file, "\n");
    }
    fclose(file);
}